

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall
HashCallback<Blob<256>_>::operator()(HashCallback<Blob<256>_> *this,void *key,int len)

{
  size_type sVar1;
  reference this_00;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  Blob<256> h;
  size_t newsize;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffd8;
  
  sVar1 = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::size
                    (*(vector<Blob<256>,_std::allocator<Blob<256>_>_> **)(in_RDI + 0x10));
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::resize
            ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)(sVar1 + 1),in_stack_ffffffffffffffd8
            );
  Blob<256>::Blob((Blob<256> *)&stack0xffffffffffffffc0);
  (**(code **)(in_RDI + 0x18))(in_RSI,in_EDX,0,&stack0xffffffffffffffc0);
  this_00 = std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::back(in_stack_ffffffffffffffc0);
  Blob<256>::operator=(this_00,(Blob<256> *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);

    m_hashes.back() = h;
  }